

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O2

void __thiscall Fl_Menu_Type::write_code2(Fl_Menu_Type *this)

{
  Fl_Type **ppFVar1;
  Fl_Type *pFVar2;
  Fl_Type *pFVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  int iVar12;
  uint uVar13;
  Fl_Type **ppFVar14;
  int i;
  
  pFVar2 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
  if ((pFVar2 != (Fl_Type *)0x0) && (iVar4 = (*pFVar2->_vptr_Fl_Type[0x1e])(), iVar4 != 0)) {
    if (i18n_type != 0) {
      ppFVar1 = &(this->super_Fl_Widget_Type).super_Fl_Type.next;
      pFVar2 = *ppFVar1;
      pcVar8 = Fl_Menu_Item_Type::menu_name((Fl_Menu_Item_Type *)pFVar2,&i);
      iVar4 = 0;
      uVar13 = 0;
      ppFVar14 = ppFVar1;
      while ((pFVar3 = *ppFVar14, pFVar3 != (Fl_Type *)0x0 &&
             (iVar5 = (*pFVar3->_vptr_Fl_Type[0x1e])(pFVar3), iVar5 != 0))) {
        iVar4 = (iVar4 + 1) - (uint)(pFVar3->label_ == (char *)0x0);
        iVar5 = pFVar3->level;
        iVar6 = (*pFVar3->_vptr_Fl_Type[0x16])(pFVar3);
        iVar5 = (iVar5 + 1) - (uint)(iVar6 == 0);
        ppFVar14 = &pFVar3->next;
        if ((pFVar3->next == (Fl_Type *)0x0) ||
           (iVar6 = (*pFVar3->next->_vptr_Fl_Type[0x1e])(), iVar6 == 0)) {
          iVar6 = (*ppFVar1)->level + 1;
        }
        else {
          iVar6 = (*ppFVar14)->level;
        }
        iVar12 = iVar5 - iVar6;
        iVar7 = iVar12 + 1;
        if (iVar12 == 0 || iVar5 < iVar6) {
          iVar7 = 1;
        }
        uVar13 = uVar13 + iVar7;
      }
      if (iVar4 != 0) {
        pcVar9 = indent();
        write_c("%sif (!%s_i18n_done) {\n",pcVar9,pcVar8);
        pcVar9 = indent();
        write_c("%s  int i=0;\n",pcVar9);
        pcVar9 = indent();
        write_c("%s  for ( ; i<%d; i++)\n",pcVar9,(ulong)uVar13);
        pcVar9 = indent();
        write_c("%s    if (%s[i].label())\n",pcVar9,pcVar8);
        if (i18n_type == 2) {
          pcVar10 = indent();
          pcVar9 = i18n_set;
          pcVar11 = "_catalog";
          if (*i18n_file != '\0') {
            pcVar11 = i18n_file;
          }
          uVar13 = Fl_Type::msgnum(pFVar2);
          write_c("%s      %s[i].label(catgets(%s,%s,i+%d,%s[i].label()));\n",pcVar10,pcVar8,pcVar11
                  ,pcVar9,(ulong)uVar13,pcVar8);
        }
        else if (i18n_type == 1) {
          pcVar9 = indent();
          write_c("%s      %s[i].label(%s(%s[i].label()));\n",pcVar9,pcVar8,i18n_function,pcVar8);
        }
        pcVar9 = indent();
        write_c("%s  %s_i18n_done = 1;\n",pcVar9,pcVar8);
        pcVar8 = indent();
        write_c("%s}\n",pcVar8);
      }
    }
    pcVar11 = indent();
    pcVar8 = (this->super_Fl_Widget_Type).super_Fl_Type.name_;
    pcVar9 = "o";
    if (pcVar8 != (char *)0x0) {
      pcVar9 = pcVar8;
    }
    pcVar8 = unique_id(this,"menu",pcVar8,(this->super_Fl_Widget_Type).super_Fl_Type.label_);
    write_c("%s%s->menu(%s);\n",pcVar11,pcVar9,pcVar8);
  }
  Fl_Widget_Type::write_code2(&this->super_Fl_Widget_Type);
  return;
}

Assistant:

void Fl_Menu_Type::write_code2() {
  if (next && next->is_menu_item()) {
    if (i18n_type) {
      // take care of i18n now!
      Fl_Menu_Item_Type *mi = (Fl_Menu_Item_Type*)next;
      int i, nItem = 0, nLabel = 0;
      const char *mName = mi->menu_name(i);
      for (Fl_Type* q = next; q && q->is_menu_item(); q = q->next) {
        if (((Fl_Menu_Item_Type*)q)->label()) nLabel++;
	int thislevel = q->level; if (q->is_parent()) thislevel++;
	int nextlevel =
	    (q->next && q->next->is_menu_item()) ? q->next->level : next->level+1;
	nItem += 1 + ((thislevel > nextlevel) ? (thislevel-nextlevel) : 0);
      }
      if (nLabel) {
        write_c("%sif (!%s_i18n_done) {\n", indent(), mName);
        write_c("%s  int i=0;\n", indent());
        write_c("%s  for ( ; i<%d; i++)\n", indent(), nItem);
        write_c("%s    if (%s[i].label())\n", indent(), mName);
        switch (i18n_type) {
          case 1:
            write_c("%s      %s[i].label(%s(%s[i].label()));\n",
                    indent(), mName, i18n_function, mName);
            break;
          case 2:
            write_c("%s      %s[i].label(catgets(%s,%s,i+%d,%s[i].label()));\n",
                    indent(), mName, i18n_file[0] ? i18n_file : "_catalog", 
                    i18n_set, mi->msgnum(), mName);
            break;
        }
        write_c("%s  %s_i18n_done = 1;\n", indent(), mName);
        write_c("%s}\n", indent());
      }
    }
    write_c("%s%s->menu(%s);\n", indent(), name() ? name() : "o",
	    unique_id(this, "menu", name(), label()));
  }
  Fl_Widget_Type::write_code2();
}